

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int i2cWriteByte(uint handle,uint bVal)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  ulong uVar4;
  
  pFVar3 = _stderr;
  uVar4 = (ulong)handle;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar3,"%s %s: handle=%d bVal=%d\n",myTimeStamp::buf,"i2cWriteByte",uVar4,(ulong)bVal);
  }
  pFVar3 = _stderr;
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    pcVar2 = "%s %s: pigpio uninitialised, call gpioInitialise()\n";
LAB_00108846:
    fprintf(pFVar3,pcVar2,myTimeStamp::buf,"i2cWriteByte");
  }
  else {
    if ((handle < 0x40) && (i2cInfo[uVar4].state == 2)) {
      if ((i2cInfo[uVar4].funcs & 0x40000) == 0) {
        iVar1 = -0x6b;
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x6b;
        }
        myTimeStamp();
        pcVar2 = "%s %s: SMBUS command not supported by driver\n";
        goto LAB_00108846;
      }
      if (bVal < 0x100) {
        handle = my_smbus_access((int)i2cInfo[uVar4].fd,'\0',(uint8_t)bVal,1,(my_smbus_data *)0x0);
        pFVar3 = _stderr;
        if (-1 < (int)handle) {
          return handle;
        }
        iVar1 = -0x52;
        if (gpioCfg.dbgLevel < 4) {
          return -0x52;
        }
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x52;
        }
        myTimeStamp();
        pcVar2 = "%s %s: error=%d (%m)\n";
        goto LAB_0010893d;
      }
      iVar1 = -0x51;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x51;
      }
      myTimeStamp();
      pcVar2 = "%s %s: bad bVal (%d)\n";
      uVar4 = (ulong)bVal;
    }
    else {
      iVar1 = -0x19;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x19;
      }
      myTimeStamp();
      pcVar2 = "%s %s: bad handle (%d)\n";
LAB_0010893d:
      uVar4 = (ulong)handle;
    }
    fprintf(pFVar3,pcVar2,myTimeStamp::buf,"i2cWriteByte",uVar4);
  }
  return iVar1;
}

Assistant:

int i2cWriteByte(unsigned handle, unsigned bVal)
{
   int status;

   DBG(DBG_USER, "handle=%d bVal=%d", handle, bVal);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_WRITE_BYTE) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (bVal > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad bVal (%d)", bVal);

   status = my_smbus_access(
            i2cInfo[handle].fd,
            PI_I2C_SMBUS_WRITE,
            bVal,
            PI_I2C_SMBUS_BYTE,
            NULL);

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_WRITE_FAILED;
   }

   return status;
}